

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::namespace_uri_predicate::namespace_uri_predicate
          (namespace_uri_predicate *this,char_t *name)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = strchr((char *)name,0x3a);
  sVar2 = (long)pcVar1 - (long)name;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
    name = (char_t *)0x0;
  }
  this->prefix = name;
  this->prefix_length = sVar2;
  return;
}

Assistant:

namespace_uri_predicate(const char_t* name)
		{
			const char_t* pos = find_char(name, ':');

			prefix = pos ? name : 0;
			prefix_length = pos ? static_cast<size_t>(pos - name) : 0;
		}